

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

void __thiscall
wasm::Debug::AddrExprMap::add(AddrExprMap *this,Expression *expr,DelimiterLocations *delimiter)

{
  uint *puVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  uint uVar4;
  ulong i;
  
  uVar4 = 0;
  do {
    i = (ulong)uVar4;
    if (((long)(delimiter->super_SmallVector<unsigned_int,_1UL>).flexible.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(delimiter->super_SmallVector<unsigned_int,_1UL>).flexible.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) +
        (delimiter->super_SmallVector<unsigned_int,_1UL>).usedFixed <= i) {
      return;
    }
    puVar1 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,i);
    if (*puVar1 != 0) {
      puVar1 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,i);
      sVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(this->delimiterMap)._M_h,puVar1);
      if (sVar2 != 0) {
        __assert_fail("delimiterMap.count(delimiter[i]) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                      ,0x1a9,
                      "void wasm::Debug::AddrExprMap::add(Expression *, const BinaryLocations::DelimiterLocations &)"
                     );
      }
      puVar1 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](delimiter,i);
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->delimiterMap,puVar1);
      pmVar3->expr = expr;
      pmVar3->id = i;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void add(Expression* expr,
           const BinaryLocations::DelimiterLocations& delimiter) {
    for (Index i = 0; i < delimiter.size(); i++) {
      if (delimiter[i] != 0) {
        assert(delimiterMap.count(delimiter[i]) == 0);
        delimiterMap[delimiter[i]] = DelimiterInfo{expr, i};
      }
    }
  }